

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O1

void __thiscall QNetworkProxy::setCapabilities(QNetworkProxy *this,Capabilities capabilities)

{
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  (((this->d).d.ptr)->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
  super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (Int)capabilities.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
            super_QFlagsStorage<QNetworkProxy::Capability>.i;
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  ((this->d).d.ptr)->capabilitiesSet = true;
  return;
}

Assistant:

void QNetworkProxy::setCapabilities(Capabilities capabilities)
{
    d->capabilities = capabilities;
    d->capabilitiesSet = true;
}